

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void reshade(bool keep)

{
  Camera *this;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ThreadPool *this_00;
  clock_t cVar6;
  ostream *poVar7;
  byte in_DIL;
  time_t t2;
  int ww;
  int j;
  int y_1;
  int x_3;
  int x_2;
  int x_1;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> v;
  int y;
  int x;
  time_t t1;
  int s;
  int h;
  int w;
  Camera *camera;
  int ls;
  uchar *img;
  Vector3f *in_stack_ffffffffffffff18;
  Vector3f *in_stack_ffffffffffffff20;
  future<bool> *in_stack_ffffffffffffff28;
  allocator_type *in_stack_ffffffffffffff30;
  size_type in_stack_ffffffffffffff38;
  vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *in_stack_ffffffffffffff40;
  float *in_stack_ffffffffffffff48;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_70;
  pointer in_stack_ffffffffffffffb0;
  pointer in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  void *local_10;
  
  this = scene.camera;
  bVar1 = (bool)(in_DIL & 1);
  if (bVar1 == false) {
    cnt = 1;
  }
  else {
    cnt = cnt + 1;
  }
  local_10 = (void *)0x0;
  iVar2 = Camera::getWidth(scene.camera);
  iVar3 = Camera::getHeight(this);
  iVar4 = iVar2 * iVar3 * 3;
  if (iVar4 != 0) {
    free((void *)0x0);
    local_10 = malloc((long)iVar4);
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"shading start (");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar1);
  poVar5 = std::operator<<(poVar5,",");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,cnt);
  poVar5 = std::operator<<(poVar5,")");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  this_00 = (ThreadPool *)clock();
  if (bVar1 == false) {
    for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < iVar2;
        in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
      for (in_stack_ffffffffffffffc0 = 0; in_stack_ffffffffffffffc0 < iVar3;
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
        Vector3f::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
    }
  }
  std::allocator<std::future<bool>_>::allocator((allocator<std::future<bool>_> *)0x285ec1);
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::vector
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<std::future<bool>_>::~allocator((allocator<std::future<bool>_> *)0x285ee7);
  for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
    ThreadPool::enqueue<bool(&)(Camera*,int),Camera*&,int&>
              (this_00,(_func_bool_Camera_ptr_int *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (Camera **)in_stack_ffffffffffffffb8,(int *)in_stack_ffffffffffffffb0);
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::operator[]
              ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)
               &stack0xffffffffffffffa8,(long)local_70);
    std::future<bool>::operator=
              ((future<bool> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::future<bool>::~future((future<bool> *)0x285f50);
  }
  for (local_84 = 0; local_84 < iVar2; local_84 = local_84 + 1) {
    std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::operator[]
              ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)
               &stack0xffffffffffffffa8,(long)local_84);
    std::future<bool>::get((future<bool> *)in_stack_ffffffffffffff40);
  }
  for (local_88 = 0; iVar4 = (int)(in_stack_ffffffffffffff38 >> 0x20), local_88 < iVar2;
      local_88 = local_88 + 1) {
    for (local_8c = 0; local_8c < iVar3; local_8c = local_8c + 1) {
      for (local_90 = 0; local_90 < 3; local_90 = local_90 + 1) {
        in_stack_ffffffffffffff48 =
             Vector3f::operator[]
                       ((Vector3f *)(tot + (long)local_8c * 0xc + (long)local_88 * 24000),local_90);
        local_94 = (int)((*in_stack_ffffffffffffff48 / (float)cnt) * 255.0);
        if (local_94 < 0) {
          local_94 = 0;
        }
        if (0xff < local_94) {
          local_94 = 0xff;
        }
        *(char *)((long)local_10 + (long)(local_88 * 3 + local_8c * iVar2 * 3 + local_90)) =
             (char)local_94;
      }
    }
  }
  cVar6 = clock();
  stbi_write_bmp((char *)in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                 (int)in_stack_ffffffffffffff40,iVar4,in_stack_ffffffffffffff30);
  poVar5 = std::operator<<((ostream *)&std::cerr,"end shading ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(double)(cVar6 - (long)this_00) / 1000000.0);
  poVar5 = std::operator<<(poVar5,"s    ");
  poVar7 = (ostream *)
           std::ostream::operator<<(poVar5,1.0 / ((double)(cVar6 - (long)this_00) / 1000000.0));
  std::operator<<(poVar7,"fps\n");
  poVar7 = std::operator<<((ostream *)&std::cerr,"time passed: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(double)cVar6 / 1000000.0);
  std::operator<<(poVar7,"s\n");
  std::vector<std::future<bool>,_std::allocator<std::future<bool>_>_>::~vector
            ((vector<std::future<bool>,_std::allocator<std::future<bool>_>_> *)poVar5);
  return;
}

Assistant:

void reshade(bool keep)
{
	if (!keep) cnt = 1; else ++cnt;
	unsigned char* img = 0; int ls = 0;
	Camera* camera = scene.camera;
	int w = camera->getWidth(), h = camera->getHeight(), s = w * h * 3;
	if (s != ls) free(img), img = (unsigned char* )malloc(sizeof(unsigned char) * (ls=s));
	std::cerr << "shading start (" << keep << "," << cnt << ")" << std::endl;
	time_t t1 = clock();
	if (!keep)
		for (int x = 0; x < w; ++x)
			for (int y = 0; y < h; ++y)
				tot[x][y] = Vector3f::ZERO;
	std::vector<std::future<bool>> v(w);
	for (int x = 0; x < w; ++x)
		v[x]=pool->enqueue(execute, camera, x);
	for (int x = 0; x < w; ++x) v[x].get();
	for (int x = 0; x < w; ++x)
		for (int y = 0; y < h; ++y)
		{
			for (int j = 0; j < 3; ++j)
			{
				int ww = tot[x][y][j] / cnt * 255;
				if (ww < 0) ww = 0;
				if (ww > 255) ww = 255;
				img[x * 3 + y * w * 3 + j] = ww;
			}
		}
	time_t t2 = clock();
	stbi_write_bmp("output.bmp", w, h, 3, img);
	std::cerr << "end shading " << (t2 - t1) * 1.0 / CLOCKS_PER_SEC << "s    " << 1.0 / ((t2 - t1) * 1.0 / CLOCKS_PER_SEC) << "fps\n";
	std::cerr << "time passed: " << t2 * 1.0 / CLOCKS_PER_SEC << "s\n";
}